

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::GetVertexAttribTest::checkVertexAttribLd<1u>
          (GetVertexAttribTest *this,GLuint index,bool *result)

{
  bool bVar1;
  GLenum err;
  ostream *poVar2;
  GLushort GVar3;
  int iVar4;
  vertexAttribute<1U> vertex_attribute;
  stringstream function_name;
  long *local_1e8;
  long local_1d8 [2];
  bool *local_1c8;
  double local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c8 = result;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"VertexAttribL",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"d",1);
  iVar4 = 0x80;
  while( true ) {
    GVar3 = Base::RandomDouble::value + 1;
    if (0x1fff < Base::RandomDouble::value) {
      GVar3 = 0;
    }
    local_1c0 = (this->m_max - this->m_min) * (double)Base::RandomDouble::value * 0.0001220703125 +
                this->m_min;
    Base::RandomDouble::value = GVar3;
    (*(this->super_Base).gl.vertexAttribL1d)(index,local_1c0);
    err = (*(this->super_Base).gl.getError)();
    std::__cxx11::stringbuf::str();
    glu::checkError(err,(char *)local_1e8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x2fe);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    bVar1 = verifyResults(this,&local_1c0,1,index,(char *)local_1e8,0x300);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if (!bVar1) break;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
LAB_009feb52:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return;
    }
  }
  *local_1c8 = false;
  goto LAB_009feb52;
}

Assistant:

void GetVertexAttribTest::checkVertexAttribLd(GLuint index, bool& result) const
{
	std::stringstream function_name;

	function_name << "VertexAttribL" << SIZE << "d";

	for (GLuint i = 0; i < m_n_iterations; ++i)
	{
		vertexAttribute<SIZE> vertex_attribute(m_min, m_max);

		vertexAttribLd<SIZE>(index, vertex_attribute);
		GLU_EXPECT_NO_ERROR(gl.getError(), function_name.str().c_str());

		if (false == verifyResults(vertex_attribute.m_array, SIZE, index, function_name.str().c_str(), __LINE__))
		{
			result = false;
			return;
		}
	}
}